

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool createNativeWindow(_GLFWwindow *window,_GLFWwndconfig *wndconfig,Visual *visual,int depth)

{
  GLFWbool GVar1;
  __pid_t _Var2;
  Colormap CVar3;
  Window WVar4;
  size_t sVar5;
  XIC p_Var6;
  long lVar7;
  int iVar8;
  undefined8 in_stack_fffffffffffffea8;
  uint uVar9;
  undefined8 in_stack_fffffffffffffeb0;
  undefined4 uVar11;
  undefined8 uVar10;
  ulong local_120;
  unsigned_long filter;
  Atom version;
  char *resourceName;
  XClassHint *hint;
  XWMHints *hints;
  Atom type;
  long pid;
  Atom protocols [2];
  uint local_cc;
  Atom local_c8;
  int count;
  Atom states [3];
  undefined1 local_a8 [8];
  XSetWindowAttributes wa;
  int local_30;
  int height;
  int width;
  int depth_local;
  Visual *visual_local;
  _GLFWwndconfig *wndconfig_local;
  _GLFWwindow *window_local;
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  uVar9 = (uint)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  local_30 = wndconfig->width;
  wa.cursor._4_4_ = wndconfig->height;
  if (wndconfig->scaleToMonitor != 0) {
    local_30 = (int)((float)local_30 * _glfw.x11.contentScaleX);
    wa.cursor._4_4_ = (int)((float)wa.cursor._4_4_ * _glfw.x11.contentScaleY);
  }
  CVar3 = XCreateColormap(_glfw.x11.display,_glfw.x11.root,visual,0);
  (window->x11).colormap = CVar3;
  GVar1 = _glfwIsVisualTransparentX11(visual);
  (window->x11).transparent = GVar1;
  memset(local_a8,0,0x70);
  wa._88_8_ = (window->x11).colormap;
  wa.save_under = 0x63807f;
  wa._68_4_ = 0;
  _glfwGrabErrorHandlerX11();
  uVar10 = CONCAT44(uVar11,depth);
  WVar4 = XCreateWindow(_glfw.x11.display,_glfw.x11.root,0,0,local_30,wa.cursor._4_4_,
                        (ulong)uVar9 << 0x20,uVar10,1,visual,0x2808,local_a8);
  uVar11 = (undefined4)((ulong)uVar10 >> 0x20);
  (window->x11).handle = WVar4;
  _glfwReleaseErrorHandlerX11();
  if ((window->x11).handle == 0) {
    _glfwInputErrorX11(0x10008,"X11: Failed to create window");
    window_local._4_4_ = 0;
  }
  else {
    XSaveContext(_glfw.x11.display,(window->x11).handle,_glfw.x11.context,window);
    if (wndconfig->decorated == 0) {
      _glfwPlatformSetWindowDecorated(window,0);
    }
    if ((_glfw.x11.NET_WM_STATE != 0) && (window->monitor == (_GLFWmonitor *)0x0)) {
      local_cc = 0;
      if (wndconfig->floating != 0) {
        if (_glfw.x11.NET_WM_STATE_ABOVE != 0) {
          local_c8 = _glfw.x11.NET_WM_STATE_ABOVE;
        }
        local_cc = (uint)(_glfw.x11.NET_WM_STATE_ABOVE != 0);
      }
      if (((wndconfig->maximized != 0) && (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT != 0)) &&
         (_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ != 0)) {
        iVar8 = local_cc + 1;
        *(Atom *)(local_a8 + (long)(int)local_cc * 8 + -0x20) =
             _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
        local_cc = local_cc + 2;
        *(Atom *)(local_a8 + (long)iVar8 * 8 + -0x20) = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
        (window->x11).maximized = 1;
      }
      if (local_cc != 0) {
        uVar10 = CONCAT44(uVar11,local_cc);
        XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_STATE,4,0x20,0,
                        &stack0xffffffffffffff38,uVar10);
        uVar11 = (undefined4)((ulong)uVar10 >> 0x20);
      }
    }
    pid = _glfw.x11.WM_DELETE_WINDOW;
    protocols[0] = _glfw.x11.NET_WM_PING;
    XSetWMProtocols(_glfw.x11.display,(window->x11).handle,&pid,2);
    _Var2 = getpid();
    type = (Atom)_Var2;
    uVar10 = CONCAT44(uVar11,1);
    XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_PID,6,0x20,0,&type,
                    uVar10);
    uVar11 = (undefined4)((ulong)uVar10 >> 0x20);
    if ((_glfw.x11.NET_WM_WINDOW_TYPE != 0) && (_glfw.x11.NET_WM_WINDOW_TYPE_NORMAL != 0)) {
      hints = (XWMHints *)_glfw.x11.NET_WM_WINDOW_TYPE_NORMAL;
      uVar10 = CONCAT44(uVar11,1);
      XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_WINDOW_TYPE,4,0x20,0,
                      &hints,uVar10);
      uVar11 = (undefined4)((ulong)uVar10 >> 0x20);
    }
    hint = (XClassHint *)XAllocWMHints();
    if (hint == (XClassHint *)0x0) {
      _glfwInputError(0x10005,"X11: Failed to allocate WM hints");
      window_local._4_4_ = 0;
    }
    else {
      hint->res_name = (char *)0x2;
      *(undefined4 *)((long)&hint->res_class + 4) = 1;
      XSetWMHints(_glfw.x11.display,(window->x11).handle,hint);
      XFree(hint);
      updateNormalHints(window,local_30,wa.cursor._4_4_);
      resourceName = (char *)XAllocClassHint();
      sVar5 = strlen((wndconfig->x11).instanceName);
      if ((sVar5 == 0) || (sVar5 = strlen((wndconfig->x11).className), sVar5 == 0)) {
        version = (Atom)getenv("RESOURCE_NAME");
        if (((char *)version == (char *)0x0) || (sVar5 = strlen((char *)version), sVar5 == 0)) {
          sVar5 = strlen(wndconfig->title);
          if (sVar5 == 0) {
            *(char **)resourceName = "glfw-application";
          }
          else {
            *(char **)resourceName = wndconfig->title;
          }
        }
        else {
          *(Atom *)resourceName = version;
        }
        sVar5 = strlen(wndconfig->title);
        if (sVar5 == 0) {
          *(char **)(resourceName + 8) = "GLFW-Application";
        }
        else {
          *(char **)(resourceName + 8) = wndconfig->title;
        }
      }
      else {
        *(char **)resourceName = (wndconfig->x11).instanceName;
        *(anon_struct_512_2_6156221b_for_x11 **)(resourceName + 8) = &wndconfig->x11;
      }
      XSetClassHint(_glfw.x11.display,(window->x11).handle,resourceName);
      XFree(resourceName);
      filter = 5;
      XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.XdndAware,4,0x20,0,&filter,
                      CONCAT44(uVar11,1));
      _glfwPlatformSetWindowTitle(window,wndconfig->title);
      if (_glfw.x11.im != (XIM)0x0) {
        p_Var6 = (XIC)XCreateIC(_glfw.x11.im,"inputStyle",0x408,"clientWindow",(window->x11).handle,
                                "focusWindow",(window->x11).handle,0);
        (window->x11).ic = p_Var6;
      }
      if ((window->x11).ic != (XIC)0x0) {
        local_120 = 0;
        lVar7 = XGetICValues((window->x11).ic,"filterEvents",&local_120,0);
        if (lVar7 == 0) {
          XSelectInput(_glfw.x11.display,(window->x11).handle,wa._64_8_ | local_120);
        }
      }
      _glfwPlatformGetWindowPos(window,&(window->x11).xpos,&(window->x11).ypos);
      _glfwPlatformGetWindowSize(window,&(window->x11).width,&(window->x11).height);
      window_local._4_4_ = 1;
    }
  }
  return window_local._4_4_;
}

Assistant:

static GLFWbool createNativeWindow(_GLFWwindow* window,
                                   const _GLFWwndconfig* wndconfig,
                                   Visual* visual, int depth)
{
    int width = wndconfig->width;
    int height = wndconfig->height;

    if (wndconfig->scaleToMonitor)
    {
        width *= _glfw.x11.contentScaleX;
        height *= _glfw.x11.contentScaleY;
    }

    // Create a colormap based on the visual used by the current context
    window->x11.colormap = XCreateColormap(_glfw.x11.display,
                                           _glfw.x11.root,
                                           visual,
                                           AllocNone);

    window->x11.transparent = _glfwIsVisualTransparentX11(visual);

    XSetWindowAttributes wa = { 0 };
    wa.colormap = window->x11.colormap;
    wa.event_mask = StructureNotifyMask | KeyPressMask | KeyReleaseMask |
                    PointerMotionMask | ButtonPressMask | ButtonReleaseMask |
                    ExposureMask | FocusChangeMask | VisibilityChangeMask |
                    EnterWindowMask | LeaveWindowMask | PropertyChangeMask;

    _glfwGrabErrorHandlerX11();

    window->x11.handle = XCreateWindow(_glfw.x11.display,
                                       _glfw.x11.root,
                                       0, 0,   // Position
                                       width, height,
                                       0,      // Border width
                                       depth,  // Color depth
                                       InputOutput,
                                       visual,
                                       CWBorderPixel | CWColormap | CWEventMask,
                                       &wa);

    _glfwReleaseErrorHandlerX11();

    if (!window->x11.handle)
    {
        _glfwInputErrorX11(GLFW_PLATFORM_ERROR,
                           "X11: Failed to create window");
        return GLFW_FALSE;
    }

    XSaveContext(_glfw.x11.display,
                 window->x11.handle,
                 _glfw.x11.context,
                 (XPointer) window);

    if (!wndconfig->decorated)
        _glfwPlatformSetWindowDecorated(window, GLFW_FALSE);

    if (_glfw.x11.NET_WM_STATE && !window->monitor)
    {
        Atom states[3];
        int count = 0;

        if (wndconfig->floating)
        {
            if (_glfw.x11.NET_WM_STATE_ABOVE)
                states[count++] = _glfw.x11.NET_WM_STATE_ABOVE;
        }

        if (wndconfig->maximized)
        {
            if (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT &&
                _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ)
            {
                states[count++] = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
                states[count++] = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
                window->x11.maximized = GLFW_TRUE;
            }
        }

        if (count)
        {
            XChangeProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_STATE, XA_ATOM, 32,
                            PropModeReplace, (unsigned char*) states, count);
        }
    }

    // Declare the WM protocols supported by GLFW
    {
        Atom protocols[] =
        {
            _glfw.x11.WM_DELETE_WINDOW,
            _glfw.x11.NET_WM_PING
        };

        XSetWMProtocols(_glfw.x11.display, window->x11.handle,
                        protocols, sizeof(protocols) / sizeof(Atom));
    }

    // Declare our PID
    {
        const long pid = getpid();

        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_PID, XA_CARDINAL, 32,
                        PropModeReplace,
                        (unsigned char*) &pid, 1);
    }

    if (_glfw.x11.NET_WM_WINDOW_TYPE && _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL)
    {
        Atom type = _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL;
        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_WINDOW_TYPE, XA_ATOM, 32,
                        PropModeReplace, (unsigned char*) &type, 1);
    }

    // Set ICCCM WM_HINTS property
    {
        XWMHints* hints = XAllocWMHints();
        if (!hints)
        {
            _glfwInputError(GLFW_OUT_OF_MEMORY,
                            "X11: Failed to allocate WM hints");
            return GLFW_FALSE;
        }

        hints->flags = StateHint;
        hints->initial_state = NormalState;

        XSetWMHints(_glfw.x11.display, window->x11.handle, hints);
        XFree(hints);
    }

    updateNormalHints(window, width, height);

    // Set ICCCM WM_CLASS property
    {
        XClassHint* hint = XAllocClassHint();

        if (strlen(wndconfig->x11.instanceName) &&
            strlen(wndconfig->x11.className))
        {
            hint->res_name = (char*) wndconfig->x11.instanceName;
            hint->res_class = (char*) wndconfig->x11.className;
        }
        else
        {
            const char* resourceName = getenv("RESOURCE_NAME");
            if (resourceName && strlen(resourceName))
                hint->res_name = (char*) resourceName;
            else if (strlen(wndconfig->title))
                hint->res_name = (char*) wndconfig->title;
            else
                hint->res_name = (char*) "glfw-application";

            if (strlen(wndconfig->title))
                hint->res_class = (char*) wndconfig->title;
            else
                hint->res_class = (char*) "GLFW-Application";
        }

        XSetClassHint(_glfw.x11.display, window->x11.handle, hint);
        XFree(hint);
    }

    // Announce support for Xdnd (drag and drop)
    {
        const Atom version = _GLFW_XDND_VERSION;
        XChangeProperty(_glfw.x11.display, window->x11.handle,
                        _glfw.x11.XdndAware, XA_ATOM, 32,
                        PropModeReplace, (unsigned char*) &version, 1);
    }

    _glfwPlatformSetWindowTitle(window, wndconfig->title);

    if (_glfw.x11.im)
    {
        window->x11.ic = XCreateIC(_glfw.x11.im,
                                   XNInputStyle,
                                   XIMPreeditNothing | XIMStatusNothing,
                                   XNClientWindow,
                                   window->x11.handle,
                                   XNFocusWindow,
                                   window->x11.handle,
                                   NULL);
    }

    if (window->x11.ic)
    {
        unsigned long filter = 0;
        if (XGetICValues(window->x11.ic, XNFilterEvents, &filter, NULL) == NULL)
            XSelectInput(_glfw.x11.display, window->x11.handle, wa.event_mask | filter);
    }

    _glfwPlatformGetWindowPos(window, &window->x11.xpos, &window->x11.ypos);
    _glfwPlatformGetWindowSize(window, &window->x11.width, &window->x11.height);

    return GLFW_TRUE;
}